

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000014b600 = 0x2d2d2d2d2d2d2d;
    uRam000000000014b607 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0014b5f0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000014b5f8 = 0x2d2d2d2d2d2d2d;
    DAT_0014b5ff = 0x2d;
    _DAT_0014b5e0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000014b5e8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0014b5d0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000014b5d8 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam000000000014b5c8 = 0x2d2d2d2d2d2d2d2d;
    DAT_0014b60f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }